

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
StrictMockProblemBuilder::StrictMockProblemBuilder(StrictMockProblemBuilder *this,TestSolver *s)

{
  bool bVar1;
  ReturnRefAction<StrictMockProblemBuilder> this_00;
  TestSolver *in_RSI;
  StrictMockProblemBuilder *in_RDI;
  Action<StrictMockProblemBuilder_&()> *in_stack_00000018;
  TypedExpectation<StrictMockProblemBuilder_&()> *in_stack_00000020;
  char *in_stack_00000090;
  char *in_stack_00000098;
  int in_stack_000000a4;
  char *in_stack_000000a8;
  MockSpec<StrictMockProblemBuilder_&()> *in_stack_000000b0;
  StrictMockProblemBuilder *in_stack_ffffffffffffff98;
  StrictMockProblemBuilder *in_stack_ffffffffffffffa0;
  StrictMock<MockProblemBuilder> *in_stack_ffffffffffffffc0;
  
  testing::StrictMock<MockProblemBuilder>::StrictMock(in_stack_ffffffffffffffc0);
  (in_RDI->super_StrictMock<MockProblemBuilder>)._vptr_StrictMock =
       (_func_int **)&PTR__StrictMockProblemBuilder_0039c9f8;
  testing::internal::FunctionMocker<StrictMockProblemBuilder_&()>::FunctionMocker
            ((FunctionMocker<StrictMockProblemBuilder_&()> *)in_stack_ffffffffffffffa0);
  in_RSI->builder = in_RDI;
  bVar1 = TestSolver::call_problem(in_RSI);
  if (bVar1) {
    gmock_problem(in_stack_ffffffffffffffa0);
    testing::internal::MockSpec<StrictMockProblemBuilder_&()>::InternalExpectedAt
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_00000098,
               in_stack_00000090);
    this_00 = testing::ReturnRef<StrictMockProblemBuilder>(in_stack_ffffffffffffff98);
    testing::internal::ReturnRefAction::operator_cast_to_Action
              ((ReturnRefAction<StrictMockProblemBuilder> *)this_00.ref_);
    testing::internal::TypedExpectation<StrictMockProblemBuilder_&()>::WillOnce
              (in_stack_00000020,in_stack_00000018);
    testing::Action<StrictMockProblemBuilder_&()>::~Action
              ((Action<StrictMockProblemBuilder_&()> *)0x22818e);
  }
  return;
}

Assistant:

explicit StrictMockProblemBuilder(TestSolver &s) {
    s.builder = this;
    if (s.call_problem())
      EXPECT_CALL(*this, problem()).WillOnce(testing::ReturnRef(*this));
  }